

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Dtc_ObjComputeTruth(Gia_Man_t *p,int iObj,int *pCut,int *pTruth)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int i;
  long lVar3;
  uint *puVar4;
  
  puVar4 = &DAT_007d6720;
  for (lVar3 = 1; lVar3 <= *pCut; lVar3 = lVar3 + 1) {
    uVar1 = *puVar4;
    pGVar2 = Gia_ManObj(p,pCut[lVar3]);
    pGVar2->Value = uVar1;
    puVar4 = puVar4 + 1;
  }
  pGVar2 = Gia_ManObj(p,iObj);
  uVar1 = Dtc_ObjComputeTruth_rec(pGVar2);
  pGVar2 = Gia_ManObj(p,iObj);
  Dtc_ObjCleanTruth_rec(pGVar2);
  if (pTruth != (int *)0x0) {
    *pTruth = uVar1 & 0xff;
  }
  uVar1 = uVar1 & 0xff;
  if (((0x36 < uVar1 - 0x17) || ((0x40000000100001U >> ((ulong)(uVar1 - 0x17) & 0x3f) & 1) == 0)) &&
     ((0x36 < uVar1 - 0xb2 || ((0x40000400000001U >> ((ulong)(uVar1 - 0xb2) & 0x3f) & 1) == 0)))) {
    if (uVar1 == 0x69) {
      return 1;
    }
    if ((uVar1 != 0x71) && (uVar1 != 0x8e)) {
      if (uVar1 == 0x96) {
        return 1;
      }
      return 0;
    }
  }
  return 2;
}

Assistant:

int Dtc_ObjComputeTruth( Gia_Man_t * p, int iObj, int * pCut, int * pTruth )
{
    unsigned Truth, Truths[3] = { 0xAA, 0xCC, 0xF0 }; int i;
    for ( i = 1; i <= pCut[0]; i++ )
        Gia_ManObj(p, pCut[i])->Value = Truths[i-1];
    Truth = 0xFF & Dtc_ObjComputeTruth_rec( Gia_ManObj(p, iObj) );
    Dtc_ObjCleanTruth_rec( Gia_ManObj(p, iObj) );
    if ( pTruth ) 
        *pTruth = Truth;
    if ( Truth == 0x96 || Truth == 0x69 )
        return 1;
    if ( Truth == 0xE8 || Truth == 0xD4 || Truth == 0xB2 || Truth == 0x71 ||
         Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x8E )
        return 2;
    return 0;
}